

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::emit_subgroup_op(CompilerGLSL *this,Instruction *i)

{
  ushort uVar1;
  BaseType BVar2;
  uint32_t result_id;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t *ops;
  SPIRType *pSVar7;
  CompilerError *this_00;
  Feature feature;
  uint32_t uVar8;
  char *pcVar9;
  BaseType input_type;
  uint uVar10;
  string local_50;
  
  ops = Compiler::stream(&this->super_Compiler,i);
  uVar1 = i->op;
  if (((this->options).vulkan_semantics == false) &&
     (bVar3 = is_supported_subgroup_op_in_opengl((uint)uVar1,ops), !bVar3)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"This subgroup operation is only supported in Vulkan semantics.");
    goto LAB_002ee53d;
  }
  uVar4 = get_integer_width_for_instruction(this,i);
  uVar10 = uVar4 - 8 >> 3;
  uVar5 = uVar4 << 0x1d | uVar10;
  if ((7 < uVar5) || ((0x8bU >> (uVar10 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_002ee53d;
  }
  if ((0x8bU >> (uVar10 & 0x1f) & 1) == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_002ee53d;
  }
  uVar10 = uVar1 - OpGroupNonUniformElect;
  if (0x21 < uVar10) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
    goto LAB_002ee53d;
  }
  input_type = *(BaseType *)(&DAT_003944e0 + (ulong)uVar5 * 4);
  BVar2 = *(BaseType *)(&DAT_00394500 + (ulong)uVar5 * 4);
  switch(uVar10) {
  case 0:
    feature = SubgroupElect;
    break;
  case 1:
  case 2:
  case 3:
    pSVar7 = Compiler::expression_type(&this->super_Compiler,ops[3]);
    if ((pSVar7->basetype == Boolean) && (pSVar7->vecsize == 1)) {
      feature = SubgroupAll_Any_AllEqualBool;
    }
    else {
      feature = SubgroupAllEqualT;
    }
    break;
  case 4:
  case 5:
    feature = SubgroupBroadcast_First;
    break;
  case 6:
    feature = SubgroupBallot;
    break;
  case 7:
switchD_002ed971_caseD_7:
    feature = SubgroupInverseBallot_InclBitCount_ExclBitCout;
    break;
  case 8:
    feature = SubgroupBallotBitExtract;
    break;
  case 9:
    if (ops[3] == 0) {
      feature = SubgroupBallotBitCount;
      break;
    }
    if (ops[3] < 3) goto switchD_002ed971_caseD_7;
    goto LAB_002edd12;
  case 10:
  case 0xb:
    feature = SubgroupBallotFindLSB_MSB;
    break;
  case 0xc:
  case 0xd:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_shuffle","");
    require_extension_internal(this,&local_50);
    goto LAB_002edabd;
  case 0xe:
  case 0xf:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_shuffle_relative","");
    require_extension_internal(this,&local_50);
    goto LAB_002edabd;
  case 0x10:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIAddExclusiveScan;
      break;
    case 3:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
      goto LAB_002edabd;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x11:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFAddReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFAddInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFAddExclusiveScan;
      break;
    case 3:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
      goto LAB_002edabd;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x12:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticIMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticIMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticIMulExclusiveScan;
      break;
    case 3:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
      goto LAB_002edabd;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x13:
    switch(ops[3]) {
    case 0:
      feature = SubgroupArithmeticFMulReduce;
      break;
    case 1:
      feature = SubgroupArithmeticFMulInclusiveScan;
      break;
    case 2:
      feature = SubgroupArithmeticFMulExclusiveScan;
      break;
    case 3:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
      goto LAB_002edabd;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  default:
    if (ops[3] == 3) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_clustered","");
      require_extension_internal(this,&local_50);
    }
    else {
      if (2 < ops[3]) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid group operation.");
        goto LAB_002ee53d;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"GL_KHR_shader_subgroup_arithmetic","");
      require_extension_internal(this,&local_50);
    }
    goto LAB_002edabd;
  case 0x20:
  case 0x21:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"GL_KHR_shader_subgroup_quad","");
    require_extension_internal(this,&local_50);
LAB_002edabd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_002edd12;
  }
  request_subgroup_feature(this,feature);
LAB_002edd12:
  uVar4 = *ops;
  result_id = ops[1];
  uVar6 = Compiler::evaluate_constant_u32(&this->super_Compiler,ops[2]);
  if (uVar6 != 3) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
LAB_002ee53d:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  switch(uVar10) {
  case 0:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"subgroupElect()","");
    emit_op(this,uVar4,result_id,&local_50,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_002ee43c;
  case 1:
    uVar6 = ops[3];
    pcVar9 = "subgroupAll";
    break;
  case 2:
    uVar6 = ops[3];
    pcVar9 = "subgroupAny";
    break;
  case 3:
    uVar6 = ops[3];
    pcVar9 = "subgroupAllEqual";
    break;
  case 4:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupBroadcast";
    goto LAB_002ee415;
  case 5:
    uVar6 = ops[3];
    pcVar9 = "subgroupBroadcastFirst";
    break;
  case 6:
    uVar6 = ops[3];
    pcVar9 = "subgroupBallot";
    break;
  case 7:
    uVar6 = ops[3];
    pcVar9 = "subgroupInverseBallot";
    break;
  case 8:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupBallotBitExtract";
    goto LAB_002ee415;
  case 9:
    uVar6 = ops[3];
    if (uVar6 == 2) {
      uVar6 = ops[4];
      pcVar9 = "subgroupBallotExclusiveBitCount";
    }
    else if (uVar6 == 1) {
      uVar6 = ops[4];
      pcVar9 = "subgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar6 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_002ee53d;
      }
      uVar6 = ops[4];
      pcVar9 = "subgroupBallotBitCount";
    }
    break;
  case 10:
    uVar6 = ops[3];
    pcVar9 = "subgroupBallotFindLSB";
    break;
  case 0xb:
    uVar6 = ops[3];
    pcVar9 = "subgroupBallotFindMSB";
    break;
  case 0xc:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupShuffle";
    goto LAB_002ee415;
  case 0xd:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupShuffleXor";
    goto LAB_002ee415;
  case 0xe:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupShuffleUp";
    goto LAB_002ee415;
  case 0xf:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupShuffleDown";
    goto LAB_002ee415;
  case 0x10:
    switch(ops[3]) {
    case 0:
      goto switchD_002edf7b_caseD_0;
    case 1:
switchD_002edf7b_caseD_1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveAdd";
      break;
    case 2:
switchD_002edf7b_caseD_2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveAdd";
      break;
    case 3:
switchD_002edf7b_caseD_3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredAdd";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x11:
    switch(ops[3]) {
    case 0:
      goto switchD_002edf7b_caseD_0;
    case 1:
      goto switchD_002edf7b_caseD_1;
    case 2:
      goto switchD_002edf7b_caseD_2;
    case 3:
      goto switchD_002edf7b_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
  case 0x12:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee0f8_caseD_0;
    case 1:
switchD_002ee0f8_caseD_1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMul";
      break;
    case 2:
switchD_002ee0f8_caseD_2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMul";
      break;
    case 3:
switchD_002ee0f8_caseD_3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredMul";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x13:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee0f8_caseD_0;
    case 1:
      goto switchD_002ee0f8_caseD_1;
    case 2:
      goto switchD_002ee0f8_caseD_2;
    case 3:
      goto switchD_002ee0f8_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
  case 0x14:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMin";
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
LAB_002ee3b8:
      pcVar9 = "subgroupClusteredMin";
LAB_002ee479:
      emit_binary_func_op_cast_clustered(this,uVar4,result_id,uVar6,uVar8,pcVar9,input_type);
      goto LAB_002ee43c;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    goto LAB_002ee4a2;
  case 0x15:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMin";
      input_type = BVar2;
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMin";
      input_type = BVar2;
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMin";
      input_type = BVar2;
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      input_type = BVar2;
      goto LAB_002ee3b8;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    goto LAB_002ee4a2;
  case 0x16:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMin";
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMin";
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMin";
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredMin";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x17:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMax";
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
LAB_002ee472:
      pcVar9 = "subgroupClusteredMax";
      goto LAB_002ee479;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    goto LAB_002ee4a2;
  case 0x18:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMax";
      input_type = BVar2;
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMax";
      input_type = BVar2;
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMax";
      input_type = BVar2;
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      input_type = BVar2;
      goto LAB_002ee472;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
LAB_002ee4a2:
    emit_unary_func_op_cast(this,uVar4,result_id,uVar6,pcVar9,input_type,input_type);
    goto LAB_002ee43c;
  case 0x19:
    switch(ops[3]) {
    case 0:
      uVar6 = ops[4];
      pcVar9 = "subgroupMax";
      break;
    case 1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveMax";
      break;
    case 2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveMax";
      break;
    case 3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredMax";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x1a:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee186_caseD_0;
    case 1:
switchD_002ee186_caseD_1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveAnd";
      break;
    case 2:
switchD_002ee186_caseD_2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveAnd";
      break;
    case 3:
switchD_002ee186_caseD_3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredAnd";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x1b:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee088_caseD_0;
    case 1:
switchD_002ee088_caseD_1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveOr";
      break;
    case 2:
switchD_002ee088_caseD_2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveOr";
      break;
    case 3:
switchD_002ee088_caseD_3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredOr";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x1c:
    switch(ops[3]) {
    case 0:
      goto switchD_002edf5d_caseD_0;
    case 1:
switchD_002edf5d_caseD_1:
      uVar6 = ops[4];
      pcVar9 = "subgroupInclusiveXor";
      break;
    case 2:
switchD_002edf5d_caseD_2:
      uVar6 = ops[4];
      pcVar9 = "subgroupExclusiveXor";
      break;
    case 3:
switchD_002edf5d_caseD_3:
      uVar6 = ops[4];
      uVar8 = ops[5];
      pcVar9 = "subgroupClusteredXor";
      goto LAB_002ee415;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
    break;
  case 0x1d:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee186_caseD_0;
    case 1:
      goto switchD_002ee186_caseD_1;
    case 2:
      goto switchD_002ee186_caseD_2;
    case 3:
      goto switchD_002ee186_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
  case 0x1e:
    switch(ops[3]) {
    case 0:
      goto switchD_002ee088_caseD_0;
    case 1:
      goto switchD_002ee088_caseD_1;
    case 2:
      goto switchD_002ee088_caseD_2;
    case 3:
      goto switchD_002ee088_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
  case 0x1f:
    switch(ops[3]) {
    case 0:
      goto switchD_002edf5d_caseD_0;
    case 1:
      goto switchD_002edf5d_caseD_1;
    case 2:
      goto switchD_002edf5d_caseD_2;
    case 3:
      goto switchD_002edf5d_caseD_3;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_002ee53d;
    }
  case 0x20:
    uVar6 = ops[3];
    uVar8 = ops[4];
    pcVar9 = "subgroupQuadBroadcast";
LAB_002ee415:
    emit_binary_func_op(this,uVar4,result_id,uVar6,uVar8,pcVar9);
    goto LAB_002ee43c;
  case 0x21:
    uVar6 = Compiler::evaluate_constant_u32(&this->super_Compiler,ops[4]);
    if (uVar6 == 2) {
      uVar6 = ops[3];
      pcVar9 = "subgroupQuadSwapDiagonal";
    }
    else if (uVar6 == 1) {
      uVar6 = ops[3];
      pcVar9 = "subgroupQuadSwapVertical";
    }
    else {
      if (uVar6 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid quad swap direction.");
        goto LAB_002ee53d;
      }
      uVar6 = ops[3];
      pcVar9 = "subgroupQuadSwapHorizontal";
    }
    break;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
    goto LAB_002ee53d;
  }
LAB_002ee42f:
  emit_unary_func_op(this,uVar4,result_id,uVar6,pcVar9);
LAB_002ee43c:
  register_control_dependent_expression(this,result_id);
  return;
switchD_002edf5d_caseD_0:
  uVar6 = ops[4];
  pcVar9 = "subgroupXor";
  goto LAB_002ee42f;
switchD_002ee088_caseD_0:
  uVar6 = ops[4];
  pcVar9 = "subgroupOr";
  goto LAB_002ee42f;
switchD_002ee186_caseD_0:
  uVar6 = ops[4];
  pcVar9 = "subgroupAnd";
  goto LAB_002ee42f;
switchD_002ee0f8_caseD_0:
  uVar6 = ops[4];
  pcVar9 = "subgroupMul";
  goto LAB_002ee42f;
switchD_002edf7b_caseD_0:
  uVar6 = ops[4];
  pcVar9 = "subgroupAdd";
  goto LAB_002ee42f;
}

Assistant:

void CompilerGLSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (!options.vulkan_semantics && !is_supported_subgroup_op_in_opengl(op, ops))
		SPIRV_CROSS_THROW("This subgroup operation is only supported in Vulkan semantics.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	switch (op)
	{
	case OpGroupNonUniformElect:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupElect);
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		const GroupOperation operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitCount);
		else if (operation == GroupOperationInclusiveScan || operation == GroupOperationExclusiveScan)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
	}
	break;

	case OpGroupNonUniformBallotBitExtract:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotBitExtract);
		break;

	case OpGroupNonUniformInverseBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupInverseBallot_InclBitCount_ExclBitCout);
		break;

	case OpGroupNonUniformBallot:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallot);
		break;

	case OpGroupNonUniformBallotFindLSB:
	case OpGroupNonUniformBallotFindMSB:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBallotFindLSB_MSB);
		break;

	case OpGroupNonUniformBroadcast:
	case OpGroupNonUniformBroadcastFirst:
		request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupBroadcast_First);
		break;

	case OpGroupNonUniformShuffle:
	case OpGroupNonUniformShuffleXor:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle");
		break;

	case OpGroupNonUniformShuffleUp:
	case OpGroupNonUniformShuffleDown:
		require_extension_internal("GL_KHR_shader_subgroup_shuffle_relative");
		break;

	case OpGroupNonUniformAll:
	case OpGroupNonUniformAny:
	case OpGroupNonUniformAllEqual:
	{
		const SPIRType &type = expression_type(ops[3]);
		if (type.basetype == SPIRType::BaseType::Boolean && type.vecsize == 1u)
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAll_Any_AllEqualBool);
		else
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupAllEqualT);
	}
	break;

	// clang-format off
#define GLSL_GROUP_OP(OP)\
	case OpGroupNonUniform##OP:\
	{\
		auto operation = static_cast<GroupOperation>(ops[3]);\
		if (operation == GroupOperationClusteredReduce)\
			require_extension_internal("GL_KHR_shader_subgroup_clustered");\
		else if (operation == GroupOperationReduce)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##Reduce);\
		else if (operation == GroupOperationExclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##ExclusiveScan);\
		else if (operation == GroupOperationInclusiveScan)\
			request_subgroup_feature(ShaderSubgroupSupportHelper::SubgroupArithmetic##OP##InclusiveScan);\
		else\
			SPIRV_CROSS_THROW("Invalid group operation.");\
		break;\
	}

	GLSL_GROUP_OP(IAdd)
	GLSL_GROUP_OP(FAdd)
	GLSL_GROUP_OP(IMul)
	GLSL_GROUP_OP(FMul)

#undef GLSL_GROUP_OP
	// clang-format on

	case OpGroupNonUniformFMin:
	case OpGroupNonUniformFMax:
	case OpGroupNonUniformSMin:
	case OpGroupNonUniformSMax:
	case OpGroupNonUniformUMin:
	case OpGroupNonUniformUMax:
	case OpGroupNonUniformBitwiseAnd:
	case OpGroupNonUniformBitwiseOr:
	case OpGroupNonUniformBitwiseXor:
	case OpGroupNonUniformLogicalAnd:
	case OpGroupNonUniformLogicalOr:
	case OpGroupNonUniformLogicalXor:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationClusteredReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_clustered");
		}
		else if (operation == GroupOperationExclusiveScan || operation == GroupOperationInclusiveScan ||
		         operation == GroupOperationReduce)
		{
			require_extension_internal("GL_KHR_shader_subgroup_arithmetic");
		}
		else
			SPIRV_CROSS_THROW("Invalid group operation.");
		break;
	}

	case OpGroupNonUniformQuadSwap:
	case OpGroupNonUniformQuadBroadcast:
		require_extension_internal("GL_KHR_shader_subgroup_quad");
		break;

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "subgroupElect()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_unary_func_op(result_type, id, ops[3], "subgroupInverseBallot");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "subgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_unary_func_op(result_type, id, ops[4], "subgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAll");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAny");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "subgroupAllEqual");
		break;

		// clang-format off
#define GLSL_GROUP_OP(op, glsl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "subgroup" #glsl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupInclusive" #glsl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "subgroupExclusive" #glsl_op); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

#define GLSL_GROUP_OP_CAST(op, glsl_op, type) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroup" #glsl_op, type, type); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupInclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op_cast(result_type, id, ops[4], "subgroupExclusive" #glsl_op, type, type); \
		else if (operation == GroupOperationClusteredReduce) \
			emit_binary_func_op_cast_clustered(result_type, id, ops[4], ops[5], "subgroupClustered" #glsl_op, type); \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}

	GLSL_GROUP_OP(FAdd, Add)
	GLSL_GROUP_OP(FMul, Mul)
	GLSL_GROUP_OP(FMin, Min)
	GLSL_GROUP_OP(FMax, Max)
	GLSL_GROUP_OP(IAdd, Add)
	GLSL_GROUP_OP(IMul, Mul)
	GLSL_GROUP_OP_CAST(SMin, Min, int_type)
	GLSL_GROUP_OP_CAST(SMax, Max, int_type)
	GLSL_GROUP_OP_CAST(UMin, Min, uint_type)
	GLSL_GROUP_OP_CAST(UMax, Max, uint_type)
	GLSL_GROUP_OP(BitwiseAnd, And)
	GLSL_GROUP_OP(BitwiseOr, Or)
	GLSL_GROUP_OP(BitwiseXor, Xor)
	GLSL_GROUP_OP(LogicalAnd, And)
	GLSL_GROUP_OP(LogicalOr, Or)
	GLSL_GROUP_OP(LogicalXor, Xor)
#undef GLSL_GROUP_OP
#undef GLSL_GROUP_OP_CAST
		// clang-format on

	case OpGroupNonUniformQuadSwap:
	{
		uint32_t direction = evaluate_constant_u32(ops[4]);
		if (direction == 0)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapHorizontal");
		else if (direction == 1)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapVertical");
		else if (direction == 2)
			emit_unary_func_op(result_type, id, ops[3], "subgroupQuadSwapDiagonal");
		else
			SPIRV_CROSS_THROW("Invalid quad swap direction.");
		break;
	}

	case OpGroupNonUniformQuadBroadcast:
	{
		emit_binary_func_op(result_type, id, ops[3], ops[4], "subgroupQuadBroadcast");
		break;
	}

	default:
		SPIRV_CROSS_THROW("Invalid opcode for subgroup.");
	}

	register_control_dependent_expression(id);
}